

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall polyscope::SurfaceMesh::buildEdgeInfoGui(SurfaceMesh *this,size_t eInd)

{
  pointer puVar1;
  _Rb_tree_node_base *p_Var2;
  float fVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  puVar1 = (this->edgePerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->edgePerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    eInd = puVar1[eInd];
  }
  std::__cxx11::to_string(&local_38,eInd);
  std::operator+(&local_58,"Edge #",&local_38);
  ImGui::TextUnformatted(local_58._M_dataplus._M_p,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.0);
  ImGui::Columns(2,(char *)0x0,true);
  fVar3 = ImGui::GetWindowWidth();
  ImGui::SetColumnWidth(0,fVar3 / 3.0);
  for (p_Var2 = *(_Rb_tree_node_base **)
                 &(this->super_QuantityStructure<polyscope::SurfaceMesh>).super_Structure.
                  field_0x3d8;
      p_Var2 != (_Rb_tree_node_base *)
                &(this->super_QuantityStructure<polyscope::SurfaceMesh>).super_Structure.field_0x3c8
      ; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    (**(code **)(**(long **)(p_Var2 + 2) + 0x60))();
  }
  ImGui::Indent(-20.0);
  ImGui::Columns(1,(char *)0x0,true);
  return;
}

Assistant:

void SurfaceMesh::buildEdgeInfoGui(size_t eInd) {
  size_t displayInd = eInd;
  if (edgePerm.size() > 0) {
    displayInd = edgePerm[eInd];
  }
  ImGui::TextUnformatted(("Edge #" + std::to_string(displayInd)).c_str());

  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.);

  // Build GUI to show the quantities
  ImGui::Columns(2);
  ImGui::SetColumnWidth(0, ImGui::GetWindowWidth() / 3);
  for (auto& x : quantities) {
    x.second->buildEdgeInfoGUI(eInd);
  }

  ImGui::Indent(-20.);
  ImGui::Columns(1);
}